

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

void Cnf_DataTranformPolarity(Cnf_Dat_t *pCnf,int fTransformPos)

{
  uint uVar1;
  Vec_Ptr_t *p;
  void *__ptr;
  void *pvVar2;
  long lVar3;
  int iVar4;
  
  __ptr = calloc((long)pCnf->nVars,4);
  for (iVar4 = 0; p = pCnf->pMan->vObjs, iVar4 < p->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p,iVar4);
    if ((pvVar2 != (void *)0x0) &&
       (((fTransformPos != 0 || ((*(uint *)((long)pvVar2 + 0x18) & 7) != 3)) &&
        (-1 < (long)pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)])))) {
      *(uint *)((long)__ptr + (long)pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 4) =
           *(uint *)((long)pvVar2 + 0x18) >> 3 & 1;
    }
  }
  lVar3 = 0;
  while( true ) {
    if (pCnf->nLiterals <= lVar3) {
      free(__ptr);
      return;
    }
    uVar1 = (*pCnf->pClauses)[lVar3];
    iVar4 = (int)uVar1 >> 1;
    if (pCnf->nVars <= iVar4) break;
    if (*(int *)((long)__ptr + (long)iVar4 * 4) != 0) {
      (*pCnf->pClauses)[lVar3] = uVar1 ^ 1;
    }
    lVar3 = lVar3 + 1;
  }
  __assert_fail("iVar < pCnf->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfMan.c"
                ,0x29e,"void Cnf_DataTranformPolarity(Cnf_Dat_t *, int)");
}

Assistant:

void Cnf_DataTranformPolarity( Cnf_Dat_t * pCnf, int fTransformPos )
{
    Aig_Obj_t * pObj;
    int * pVarToPol;
    int i, iVar;
    // create map from the variable number to its polarity
    pVarToPol = ABC_CALLOC( int, pCnf->nVars );
    Aig_ManForEachObj( pCnf->pMan, pObj, i )
    {
        if ( !fTransformPos && Aig_ObjIsCo(pObj) )
            continue;
        if ( pCnf->pVarNums[pObj->Id] >= 0 )
            pVarToPol[ pCnf->pVarNums[pObj->Id] ] = pObj->fPhase;
    }
    // transform literals
    for ( i = 0; i < pCnf->nLiterals; i++ )
    {
        iVar = lit_var(pCnf->pClauses[0][i]);
        assert( iVar < pCnf->nVars );
        if ( pVarToPol[iVar] )
            pCnf->pClauses[0][i] = lit_neg( pCnf->pClauses[0][i] );
    }
    ABC_FREE( pVarToPol );
}